

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O1

void __thiscall CPU::CPY_AB(CPU *this)

{
  uint16_t uVar1;
  int iVar2;
  byte bVar3;
  
  this->cycles = 4;
  uVar1 = GetWord(this);
  this->cycles = this->cycles - 1;
  iVar2 = (*this->memory->_vptr_MemoryBus[2])(this->memory,(ulong)uVar1);
  bVar3 = this->Y - (byte)iVar2;
  (this->field_6).ps =
       bVar3 & 0x80 | (bVar3 == 0) * '\x02' | (byte)iVar2 <= this->Y | (this->field_6).ps & 0x7c;
  return;
}

Assistant:

void CPU::CPY_AB()
{
    cycles = 4;
    uint8_t op = ReadByte(GetWord());
    uint8_t res = Y - op;
    C = (Y >= op);
    Z = (Y == op);
    N = (res & 0b10000000) > 0;
}